

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPlugin.cpp
# Opt level: O0

void __thiscall
DISTRHO::Plugin::Plugin
          (Plugin *this,uint32_t parameterCount,uint32_t programCount,uint32_t stateCount)

{
  undefined1 auVar1 [16];
  PrivateData *this_00;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Parameter *pPVar6;
  ulong uVar7;
  Parameter *local_80;
  AudioPortWithBusId *local_38;
  uint32_t stateCount_local;
  uint32_t programCount_local;
  uint32_t parameterCount_local;
  Plugin *this_local;
  
  this->_vptr_Plugin = (_func_int **)&PTR__Plugin_00121b30;
  this_00 = (PrivateData *)operator_new(0x60);
  PrivateData::PrivateData(this_00);
  this->pData = this_00;
  puVar2 = (undefined8 *)operator_new__(0x108);
  *puVar2 = 4;
  local_38 = (AudioPortWithBusId *)(puVar2 + 1);
  do {
    AudioPortWithBusId::AudioPortWithBusId(local_38);
    local_38 = local_38 + 1;
  } while (local_38 != (AudioPortWithBusId *)(puVar2 + 0x21));
  this->pData->audioPorts = (AudioPortWithBusId *)(puVar2 + 1);
  if (parameterCount != 0) {
    this->pData->parameterCount = parameterCount;
    uVar3 = CONCAT44(0,parameterCount);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(0xb0),0);
    uVar7 = uVar4 + 8;
    if (SUB168(auVar1 * ZEXT816(0xb0),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar7 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar7);
    *puVar5 = uVar3;
    pPVar6 = (Parameter *)(puVar5 + 1);
    if (uVar3 != 0) {
      local_80 = pPVar6;
      do {
        Parameter::Parameter(local_80);
        local_80 = local_80 + 1;
      } while (local_80 != pPVar6 + uVar3);
    }
    this->pData->parameters = pPVar6;
  }
  if (programCount != 0) {
    d_stderr2("DPF warning: Plugins with programs must define `DISTRHO_PLUGIN_WANT_PROGRAMS` to 1");
  }
  if (stateCount != 0) {
    d_stderr2("DPF warning: Plugins with state must define `DISTRHO_PLUGIN_WANT_STATE` to 1");
  }
  return;
}

Assistant:

Plugin::Plugin(uint32_t parameterCount, uint32_t programCount, uint32_t stateCount)
    : pData(new PrivateData())
{
#if DISTRHO_PLUGIN_NUM_INPUTS+DISTRHO_PLUGIN_NUM_OUTPUTS > 0
    pData->audioPorts = new AudioPortWithBusId[DISTRHO_PLUGIN_NUM_INPUTS+DISTRHO_PLUGIN_NUM_OUTPUTS];
#endif

#ifdef DPF_ABORT_ON_ERROR
# define DPF_ABORT abort();
#else
# define DPF_ABORT
#endif

    if (parameterCount > 0)
    {
        pData->parameterCount = parameterCount;
        pData->parameters     = new Parameter[parameterCount];
    }

    if (programCount > 0)
    {
#if DISTRHO_PLUGIN_WANT_PROGRAMS
        pData->programCount = programCount;
        pData->programNames = new String[programCount];
#else
        d_stderr2("DPF warning: Plugins with programs must define `DISTRHO_PLUGIN_WANT_PROGRAMS` to 1");
        DPF_ABORT
#endif
    }

    if (stateCount > 0)
    {
#if DISTRHO_PLUGIN_WANT_STATE
        pData->stateCount     = stateCount;
        pData->stateKeys      = new String[stateCount];
        pData->stateDefValues = new String[stateCount];
#else
        d_stderr2("DPF warning: Plugins with state must define `DISTRHO_PLUGIN_WANT_STATE` to 1");
        DPF_ABORT
#endif
    }

#undef DPF_ABORT
}